

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

string * units::repr(string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (str->_M_string_length != 0) {
    pbVar3 = (byte *)(str->_M_dataplus)._M_p;
    do {
      bVar1 = *pbVar3;
      if (bVar1 < 0x22) {
        if (bVar1 != 9) {
          if (bVar1 == 10) goto LAB_0010b5fc;
          if (bVar1 != 0xd) goto LAB_0010b5e8;
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        cVar2 = '\x04' - (char)__return_storage_ptr__->_M_string_length;
        if (__return_storage_ptr__->_M_string_length == 4) {
          cVar2 = '\x04';
        }
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct((ulong)local_58,cVar2);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
        if (local_58[0] != local_48) {
          operator_delete(local_58[0]);
        }
      }
      else if (((bVar1 == 0x22) || (bVar1 == 0x27)) || (bVar1 == 0x5c)) {
LAB_0010b5fc:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
LAB_0010b5e8:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (byte *)((str->_M_dataplus)._M_p + str->_M_string_length));
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string repr(string str) {
    string result;
    result += "\'";

    for (auto it = str.begin(); it != str.end(); ++it) {
        int temp_int;
        switch(*it) {
        case '\\':
            result += "\\\\";
            break;
        case '\'':
            result += "\\\'";
            break;
        case '\"':
            result += "\\\"";
            break;
        case '\n':
            result += "\\n";
            break;
        case '\r':
            result += "\\r";
        case '\t':
            temp_int = (4 - result.size())?(4 - result.size()):4;
            result += string(temp_int, ' ');
            break;
        default:
            result += *it;
            break;
        }
    }

    result += "\'";
    return result;
}